

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

bool __thiscall
Inline::CanInlineBuiltInFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeData,OpCode inlineCallOpCode,
          FunctionJITTimeInfo *inlinerData,BuiltinFunction builtInId,bool isCallApplyTarget)

{
  code *pcVar1;
  bool bVar2;
  _E _Var3;
  ArgSlot AVar4;
  BOOL BVar5;
  uint uVar6;
  uint uVar7;
  BuiltInFlags BVar8;
  char16 *pcVar9;
  JITTimeFunctionBody *pJVar10;
  char16 *pcVar11;
  Func *pFVar12;
  JITTimeProfileInfo *this_00;
  Opnd *pOVar13;
  char16 *pcVar14;
  undefined4 *puVar15;
  RegOpnd *pRVar16;
  size_t sVar17;
  SymOpnd *pSVar18;
  StackSym *pSVar19;
  uint local_204;
  int inlineCallArgCount;
  bool usesThisArgument;
  ArgSlot actualCount;
  Opnd *linkOpnd;
  IntConstType requiredInlineCallArgCount;
  bool isAnyArgInt;
  bool canDstBeFloat;
  bool isAnyArgFloat;
  BuiltInFlags builtInFlags;
  char16 debugStringBuffer [42];
  bool isCallApplyTarget_local;
  FunctionJITTimeInfo *inlinerData_local;
  FunctionJITTimeInfo *pFStack_28;
  OpCode inlineCallOpCode_local;
  FunctionJITTimeInfo *inlineeData_local;
  Instr *callInstr_local;
  Inline *this_local;
  BuiltinFunction builtInId_local;
  
  inlinerData_local._6_2_ = inlineCallOpCode;
  pFStack_28 = inlineeData;
  inlineeData_local = (FunctionJITTimeInfo *)callInstr;
  callInstr_local = (Instr *)this;
  this_local._6_1_ = builtInId._value;
  bVar2 = Js::operator==((OpCode *)((long)&inlinerData_local + 6),0);
  if (bVar2) {
    return false;
  }
  if (((inlinerData_local._6_2_ == InlineMathFloor) || (inlinerData_local._6_2_ == InlineMathCeil))
     || (inlinerData_local._6_2_ == InlineMathRound)) {
    BVar5 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
    if (BVar5 == 0) {
      uVar6 = Func::GetSourceContextId(this->topFunc);
      uVar7 = Func::GetLocalFunctionId(this->topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
      if (bVar2) {
        pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(this_local._6_1_);
        _Var3 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&this_local + 6))
        ;
        pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
        pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
        Output::Print(L"INLINING: Skip Inline: SSE4.1 not available\tInlinee: %s (#%d)\tCaller: %s\n"
                      ,pcVar9,(ulong)_Var3,pcVar11);
        Output::Flush();
      }
      return false;
    }
    pFVar12 = Func::GetTopFunc((Func *)(inlineeData_local->m_data).sharedPropertyGuards);
    bVar2 = Func::HasProfileInfo(pFVar12);
    if (bVar2) {
      pFVar12 = Func::GetTopFunc((Func *)(inlineeData_local->m_data).sharedPropertyGuards);
      this_00 = Func::GetReadOnlyProfileInfo(pFVar12);
      bVar2 = JITTimeProfileInfo::IsFloorInliningDisabled(this_00);
      if (bVar2) {
        uVar6 = Func::GetSourceContextId(this->topFunc);
        uVar7 = Func::GetLocalFunctionId(this->topFunc);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
        if (bVar2) {
          pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(this_local._6_1_);
          _Var3 = Js::BuiltinFunction::operator_cast_to__E
                            ((BuiltinFunction *)((long)&this_local + 6));
          pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
          pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
          Output::Print(L"INLINING: Skip Inline: Floor Inlining Disabled\tInlinee: %s (#%d)\tCaller: %s\n"
                        ,pcVar9,(ulong)_Var3,pcVar11);
          Output::Flush();
        }
        return false;
      }
    }
  }
  pOVar13 = IR::Instr::GetSrc2((Instr *)inlineeData_local);
  if (pOVar13 != (Opnd *)0x0) {
    pOVar13 = IR::Instr::GetSrc2((Instr *)inlineeData_local);
    bVar2 = IR::Opnd::IsSymOpnd(pOVar13);
    if (bVar2) {
      pOVar13 = IR::Instr::GetSrc2((Instr *)inlineeData_local);
      pSVar18 = IR::Opnd::AsSymOpnd(pOVar13);
      pSVar19 = Sym::AsStackSym(pSVar18->m_sym);
      AVar4 = StackSym::GetArgSlotNum(pSVar19);
      if (0xf < AVar4) {
        uVar6 = Func::GetSourceContextId(this->topFunc);
        uVar7 = Func::GetLocalFunctionId(this->topFunc);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
        if (bVar2) {
          pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(this_local._6_1_);
          _Var3 = Js::BuiltinFunction::operator_cast_to__E
                            ((BuiltinFunction *)((long)&this_local + 6));
          pOVar13 = IR::Instr::GetSrc2((Instr *)inlineeData_local);
          pSVar18 = IR::Opnd::AsSymOpnd(pOVar13);
          pSVar19 = Sym::AsStackSym(pSVar18->m_sym);
          AVar4 = StackSym::GetArgSlotNum(pSVar19);
          pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
          pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
          pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                              (inlinerData,(wchar (*) [42])&builtInFlags);
          Output::Print(L"INLINING: Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (#%d)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (#%d)\n"
                        ,pcVar9,(ulong)_Var3,(ulong)AVar4,0xf,pcVar11,pcVar14);
          Output::Flush();
        }
        return false;
      }
    }
  }
  BVar8 = Js::JavascriptLibrary::GetFlagsForBuiltIn(this_local._6_1_);
  if (((BVar8 & BIF_TypeSpecAllToFloat) != BIF_None) &&
     (bVar2 = GlobOpt::DoFloatTypeSpec(this->topFunc), !bVar2)) {
    uVar6 = Func::GetSourceContextId(this->topFunc);
    uVar7 = Func::GetLocalFunctionId(this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
    if (bVar2) {
      pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(this_local._6_1_);
      _Var3 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&this_local + 6));
      pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])&builtInFlags);
      Output::Print(L"INLINING: Skip Inline: float type spec is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                    ,pcVar9,(ulong)_Var3,pcVar11,pcVar14);
      Output::Flush();
    }
    return false;
  }
  if ((((BVar8 & BIF_TypeSpecDstToFloat) != BIF_None) &&
      (BVar5 = Js::JavascriptLibrary::CanFloatPreferenceFunc(this_local._6_1_), BVar5 == 0)) &&
     (inlinerData_local._6_2_ != InlineArrayPop)) {
    uVar6 = Func::GetSourceContextId(this->topFunc);
    uVar7 = Func::GetLocalFunctionId(this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
    if (bVar2) {
      pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(this_local._6_1_);
      _Var3 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&this_local + 6));
      pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])&builtInFlags);
      Output::Print(L"INLINING: Skip Inline: Cannot float-type-spec the inlinee\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                    ,pcVar9,(ulong)_Var3,pcVar11,pcVar14);
      Output::Flush();
    }
    return false;
  }
  if (((BVar8 & BIF_TypeSpecAllToInt) != BIF_None) &&
     (bVar2 = GlobOpt::DoAggressiveIntTypeSpec(this->topFunc), !bVar2)) {
    uVar6 = Func::GetSourceContextId(this->topFunc);
    uVar7 = Func::GetLocalFunctionId(this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
    if (bVar2) {
      pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(this_local._6_1_);
      _Var3 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&this_local + 6));
      pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])&builtInFlags);
      Output::Print(L"INLINING: Skip Inline: int type spec is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                    ,pcVar9,(ulong)_Var3,pcVar11,pcVar14);
      Output::Flush();
    }
    return false;
  }
  if ((inlinerData_local._6_2_ == InlineMathImul) &&
     (bVar2 = GlobOpt::DoLossyIntTypeSpec(this->topFunc), !bVar2)) {
    uVar6 = Func::GetSourceContextId(this->topFunc);
    uVar7 = Func::GetLocalFunctionId(this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
    if (bVar2) {
      pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(this_local._6_1_);
      _Var3 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&this_local + 6));
      pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])&builtInFlags);
      Output::Print(L"INLINING: Skip Inline: lossy int type spec is off, it\'s required for Math.imul to do | 0 on src opnds\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                    ,pcVar9,(ulong)_Var3,pcVar11,pcVar14);
      Output::Flush();
    }
    return false;
  }
  if ((inlinerData_local._6_2_ == InlineMathClz) &&
     (bVar2 = GlobOpt::DoLossyIntTypeSpec(this->topFunc), !bVar2)) {
    uVar6 = Func::GetSourceContextId(this->topFunc);
    uVar7 = Func::GetLocalFunctionId(this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
    if (bVar2) {
      pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(this_local._6_1_);
      _Var3 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&this_local + 6));
      pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])&builtInFlags);
      Output::Print(L"INLINING: Skip Inline: lossy int type spec is off, it\'s required for Math.clz32 to do | 0 on src opnds\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                    ,pcVar9,(ulong)_Var3,pcVar11,pcVar14);
      Output::Flush();
    }
    return false;
  }
  if (inlinerData_local._6_2_ == InlineFunctionApply) {
    bVar2 = Func::GetHasStackArgs((Func *)(inlineeData_local->m_data).sharedPropertyGuards);
    if (bVar2) {
      pJVar10 = Func::GetJITFunctionBody(this->topFunc);
      bVar2 = JITTimeFunctionBody::IsInlineApplyDisabled(pJVar10);
      if (!bVar2) goto LAB_00719e79;
    }
    uVar6 = Func::GetSourceContextId(this->topFunc);
    uVar7 = Func::GetLocalFunctionId(this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
    if (bVar2) {
      pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(this_local._6_1_);
      _Var3 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&this_local + 6));
      pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])&builtInFlags);
      Output::Print(L"INLINING: Skip Inline: stack args of inlining is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                    ,pcVar9,(ulong)_Var3,pcVar11,pcVar14);
      Output::Flush();
    }
    this_local._7_1_ = false;
  }
  else {
LAB_00719e79:
    pOVar13 = IR::Instr::GetSrc1((Instr *)inlineeData_local);
    if (pOVar13 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x95c,"(callInstr->GetSrc1())","callInstr->GetSrc1()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 0;
    }
    pOVar13 = IR::Instr::GetSrc1((Instr *)inlineeData_local);
    bVar2 = IR::Opnd::IsRegOpnd(pOVar13);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x95d,"(callInstr->GetSrc1()->IsRegOpnd())",
                         "callInstr->GetSrc1()->IsRegOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 0;
    }
    pOVar13 = IR::Instr::GetSrc1((Instr *)inlineeData_local);
    pRVar16 = IR::Opnd::AsRegOpnd(pOVar13);
    if (pRVar16->m_sym == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x95e,"(callInstr->GetSrc1()->AsRegOpnd()->m_sym)",
                         "callInstr->GetSrc1()->AsRegOpnd()->m_sym");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 0;
    }
    if ((((BVar8 & BIF_IgnoreDst) == BIF_None) &&
        (pOVar13 = IR::Instr::GetDst((Instr *)inlineeData_local), pOVar13 == (Opnd *)0x0)) &&
       (inlinerData_local._6_2_ != InlineArrayPop)) {
      uVar6 = Func::GetSourceContextId(this->topFunc);
      uVar7 = Func::GetLocalFunctionId(this->topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
      if (bVar2) {
        pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(this_local._6_1_);
        _Var3 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&this_local + 6))
        ;
        pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
        pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
        pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])&builtInFlags);
        Output::Print(L"INLINING: Skip Inline: inlinee\'s return value is not assigned to anything\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                      ,pcVar9,(ulong)_Var3,pcVar11,pcVar14);
        Output::Flush();
      }
      this_local._7_1_ = false;
    }
    else {
      sVar17 = Js::JavascriptLibrary::GetArgCForBuiltIn(this_local._6_1_);
      pOVar13 = IR::Instr::GetSrc2((Instr *)inlineeData_local);
      pSVar18 = IR::Opnd::AsSymOpnd(pOVar13);
      pSVar19 = Sym::AsStackSym(pSVar18->m_sym);
      AVar4 = StackSym::GetArgSlotNum(pSVar19);
      if ((BVar8 & BIF_UseSrc0) == BIF_None) {
        local_204 = (ushort)(AVar4 - isCallApplyTarget) - 1;
      }
      else {
        local_204 = (uint)(ushort)(AVar4 - isCallApplyTarget);
      }
      if ((int)local_204 < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar15 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x973,"(inlineCallArgCount >= 0)","inlineCallArgCount >= 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar15 = 0;
      }
      bVar2 = IR::Opnd::IsSymOpnd(pOVar13);
      if (bVar2) {
        if ((BVar8 & BIF_VariableArgsNumber) == BIF_None) {
          if ((long)(int)local_204 != sVar17) {
            uVar6 = Func::GetSourceContextId(this->topFunc);
            uVar7 = Func::GetLocalFunctionId(this->topFunc);
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
            if (bVar2) {
              pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(this_local._6_1_);
              _Var3 = Js::BuiltinFunction::operator_cast_to__E
                                ((BuiltinFunction *)((long)&this_local + 6));
              pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
              pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
              pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                                  (inlinerData,(wchar (*) [42])&builtInFlags);
              Output::Print(L"INLINING: Skip Inline: parameter count doesn\'t match dynamic profile\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                            ,pcVar9,(ulong)_Var3,pcVar11,pcVar14);
              Output::Flush();
            }
            return false;
          }
        }
        else if ((long)sVar17 < (long)(int)local_204) {
          uVar6 = Func::GetSourceContextId(this->topFunc);
          uVar7 = Func::GetLocalFunctionId(this->topFunc);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
          if (bVar2) {
            pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(this_local._6_1_);
            _Var3 = Js::BuiltinFunction::operator_cast_to__E
                              ((BuiltinFunction *)((long)&this_local + 6));
            pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
            pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
            pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                                (inlinerData,(wchar (*) [42])&builtInFlags);
            Output::Print(L"INLINING: Skip Inline: parameter count exceeds the maximum number of parameters allowed\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                          ,pcVar9,(ulong)_Var3,pcVar11,pcVar14);
            Output::Flush();
          }
          return false;
        }
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
Inline::CanInlineBuiltInFunction(IR::Instr *callInstr, const FunctionJITTimeInfo * inlineeData, Js::OpCode inlineCallOpCode, const FunctionJITTimeInfo * inlinerData, Js::BuiltinFunction builtInId, bool isCallApplyTarget)
{
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    if (inlineCallOpCode == 0)
    {
        return false;
    }

    if (inlineCallOpCode == Js::OpCode::InlineMathFloor || inlineCallOpCode == Js::OpCode::InlineMathCeil || inlineCallOpCode == Js::OpCode::InlineMathRound)
    {
#if defined(_M_IX86) || defined(_M_X64)
        if (!AutoSystemInfo::Data.SSE4_1Available())
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: SSE4.1 not available\tInlinee: %s (#%d)\tCaller: %s\n"), Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId, inlinerData->GetBody()->GetDisplayName());
            return false;
        }
#endif
        if (callInstr->m_func->GetTopFunc()->HasProfileInfo() && callInstr->m_func->GetTopFunc()->GetReadOnlyProfileInfo()->IsFloorInliningDisabled())
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Floor Inlining Disabled\tInlinee: %s (#%d)\tCaller: %s\n"), Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId, inlinerData->GetBody()->GetDisplayName());
            return false;
        }
    }

    if (callInstr->GetSrc2() &&
        callInstr->GetSrc2()->IsSymOpnd() &&
        callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
        // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
        // data matching does not take into account some types of changes to source code. Need to check this again with current
        // information.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (#%d)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (#%d)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId, callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
            Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    Js::BuiltInFlags builtInFlags = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);

    bool isAnyArgFloat = (builtInFlags & Js::BuiltInFlags::BIF_TypeSpecAllToFloat) != 0;
    if (isAnyArgFloat && !GlobOpt::DoFloatTypeSpec(this->topFunc))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: float type spec is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    bool canDstBeFloat = (builtInFlags & Js::BuiltInFlags::BIF_TypeSpecDstToFloat) != 0;
    if (canDstBeFloat && !Js::JavascriptLibrary::CanFloatPreferenceFunc(builtInId) && inlineCallOpCode != Js::OpCode::InlineArrayPop)
    {
        // Note that for Math.abs that means that even though it can potentially be type-spec'd to int, we won't inline it.
        // Some built-in functions, such as atan2, are disabled for float-pref.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Cannot float-type-spec the inlinee\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId, // Get the _value (cause operator _E) to avoid using struct directly.
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    bool isAnyArgInt = (builtInFlags & (Js::BuiltInFlags::BIF_TypeSpecDstToInt | Js::BuiltInFlags::BIF_TypeSpecSrc1ToInt | Js::BuiltInFlags::BIF_TypeSpecSrc2ToInt)) != 0;
    if (isAnyArgInt && !GlobOpt::DoAggressiveIntTypeSpec(this->topFunc))
    {
        // Note that for Math.abs that means that even though it can potentially be type-spec'd to float, we won't inline it.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: int type spec is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    if (inlineCallOpCode == Js::OpCode::InlineMathImul && !GlobOpt::DoLossyIntTypeSpec(topFunc))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: lossy int type spec is off, it's required for Math.imul to do | 0 on src opnds\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    if (inlineCallOpCode == Js::OpCode::InlineMathClz && !GlobOpt::DoLossyIntTypeSpec(topFunc))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: lossy int type spec is off, it's required for Math.clz32 to do | 0 on src opnds\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    if (inlineCallOpCode == Js::OpCode::InlineFunctionApply && (!callInstr->m_func->GetHasStackArgs() || this->topFunc->GetJITFunctionBody()->IsInlineApplyDisabled()))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: stack args of inlining is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    // TODO: when adding support for other type spec args (array, string) do appropriate check as well.

    Assert(callInstr->GetSrc1());
    Assert(callInstr->GetSrc1()->IsRegOpnd());
    Assert(callInstr->GetSrc1()->AsRegOpnd()->m_sym);

    if (!(builtInFlags & Js::BuiltInFlags::BIF_IgnoreDst) && callInstr->GetDst() == nullptr && inlineCallOpCode != Js::OpCode::InlineArrayPop)
    {
        // Is seems that it's not worth optimizing odd cases where the result is unused.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: inlinee's return value is not assigned to anything\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    // Number of arguments, not including "this".
    IntConstType requiredInlineCallArgCount = (IntConstType)Js::JavascriptLibrary::GetArgCForBuiltIn(builtInId);

    IR::Opnd* linkOpnd = callInstr->GetSrc2();
    Js::ArgSlot actualCount = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() - (isCallApplyTarget ? 1 : 0);

    // Check for missing actuals:
    // if number of passed params to built-in function is not what it needs, don't inline.
    bool usesThisArgument = (builtInFlags & Js::BuiltInFlags::BIF_UseSrc0) != 0;
    int inlineCallArgCount = (int)(usesThisArgument ? actualCount : actualCount - 1);
    Assert(inlineCallArgCount >= 0);

    if (linkOpnd->IsSymOpnd())
    {
        if ((builtInFlags & Js::BuiltInFlags::BIF_VariableArgsNumber) != 0)
        {
            if (inlineCallArgCount > requiredInlineCallArgCount)
            {
                INLINE_TESTTRACE(_u("INLINING: Skip Inline: parameter count exceeds the maximum number of parameters allowed\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
                    Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
                return false;
            }
        }
        else if (inlineCallArgCount != requiredInlineCallArgCount)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: parameter count doesn't match dynamic profile\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
                Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
                inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
            return false;
        }
    }

    return true;
}